

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_spec.cpp
# Opt level: O3

size_t mjs::test_spec_runner::run
                 (gc_heap *h,vector<mjs::test_spec,_std::allocator<mjs::test_spec>_> *specs,
                 block_statement *statements)

{
  test_spec_runner tsr;
  test_spec_runner tStack_a8;
  value local_38;
  
  test_spec_runner(&tStack_a8,h,specs,statements);
  interpreter::eval(&local_38,&tStack_a8.i_,&statements->super_statement);
  value::destroy(&local_38);
  check_test_spec_done(&tStack_a8,(statements->super_statement).super_syntax_node.extend_.end);
  value::destroy(&tStack_a8.last_result_.result);
  interpreter::~interpreter(&tStack_a8.i_);
  if (tStack_a8.source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tStack_a8.source_.super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return tStack_a8.index_;
}

Assistant:

static size_t run(gc_heap& h, const std::vector<test_spec>& specs, const block_statement& statements) {
#ifdef TEST_SPEC_DEBUG
        std::wcout << "Running test spec for " << statements.extend().file->text() << "\n";
        std::wcout << "Parsed:\n";
        print(std::wcout, statements);
        std::wcout << "Specs:\n";
        for (const auto& s: specs) {
            std::wcout << pos_w << s.position << " " << s.expected.type() << " " << to_string(h, s.expected) << "\n";
        }
        std::wcout << "\n";
#endif
        test_spec_runner tsr{h, specs, statements};
        tsr.i_.eval(statements);
        tsr.check_test_spec_done(statements.extend().end);
#ifdef TEST_SPEC_DEBUG
        std::wcout << "\n";
#endif
        return tsr.index_;
    }